

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsVec2f
          (X3DImporter *this,int pAttrIdx,aiVector2D *pValue)

{
  int iVar1;
  size_type sVar2;
  pointer pFVar3;
  undefined4 extraout_var;
  reference pfVar4;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_88;
  float *local_80;
  allocator<char> local_71;
  string local_70;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_40;
  iterator it;
  vector<float,_std::allocator<float>_> tlist;
  aiVector2D *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  std::vector<float,_std::allocator<float>_>::vector((vector<float,_std::allocator<float>_> *)&it);
  __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
  __normal_iterator(&local_40);
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,(vector<float,_std::allocator<float>_> *)&it);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)&it);
  if (sVar2 != 2) {
    pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar1 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar3,(ulong)(uint)pAttrIdx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar1),&local_71);
    Throw_ConvertFail_Str2ArrF(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  local_80 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                ((vector<float,_std::allocator<float>_> *)&it);
  local_40._M_current = local_80;
  local_88 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator++(&local_40,0);
  pfVar4 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
           operator*(&local_88);
  pValue->x = *pfVar4;
  pfVar4 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
           operator*(&local_40);
  pValue->y = *pfVar4;
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&it);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsVec2f(const int pAttrIdx, aiVector2D& pValue)
{
    std::vector<float> tlist;
    std::vector<float>::iterator it;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);
	if(tlist.size() != 2) Throw_ConvertFail_Str2ArrF(mReader->getAttributeValue(pAttrIdx));

	it = tlist.begin();
	pValue.x = *it++;
	pValue.y = *it;
}